

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

int z80GetRegister8(char *source,int *RetLen)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int local_24;
  int len;
  int z;
  int *RetLen_local;
  char *source_local;
  
  local_24 = 0;
  while( true ) {
    if (Z80Registers8[local_24].name == (char *)0x0) {
      return -1;
    }
    iVar2 = (int)Z80Registers8[local_24].len;
    iVar3 = strncmp(Z80Registers8[local_24].name,source,(long)iVar2);
    if ((iVar3 == 0) &&
       (((cVar1 = source[iVar2], cVar1 == '\0' || (cVar1 == ')')) || (cVar1 == ',')))) break;
    local_24 = local_24 + 1;
  }
  *RetLen = iVar2;
  return (int)Z80Registers8[local_24].num;
}

Assistant:

int z80GetRegister8(char* source, int& RetLen)
{
	for (int z = 0; Z80Registers8[z].name != NULL; z++)
	{
		int len = Z80Registers8[z].len;
		if (strncmp(Z80Registers8[z].name,source,len) == 0)
		{
			switch (source[len])
			{
			case ')': case ',': case 0:
				RetLen = len;
				return Z80Registers8[z].num;
			default:
				break;
			}
		}
	}
	return -1;
}